

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O0

uint32_t secp256k1_scalar_get_bits_var(secp256k1_scalar *a,uint offset,uint count)

{
  uint in_EDX;
  uint in_ESI;
  secp256k1_scalar *in_RDI;
  uint32_t local_4;
  
  secp256k1_scalar_verify(in_RDI);
  if ((in_ESI + in_EDX) - 1 >> 6 == in_ESI >> 6) {
    local_4 = secp256k1_scalar_get_bits_limb32(in_RDI,in_ESI,in_EDX);
  }
  else {
    local_4 = ((uint)(in_RDI->d[in_ESI >> 6] >> ((byte)in_ESI & 0x3f)) |
              (uint)(in_RDI->d[(in_ESI >> 6) + 1] << (0x40 - ((byte)in_ESI & 0x3f) & 0x3f))) &
              0xffffffffU >> (0x20U - (char)in_EDX & 0x1f);
  }
  return local_4;
}

Assistant:

SECP256K1_INLINE static uint32_t secp256k1_scalar_get_bits_var(const secp256k1_scalar *a, unsigned int offset, unsigned int count) {
    SECP256K1_SCALAR_VERIFY(a);
    VERIFY_CHECK(count > 0 && count <= 32);
    VERIFY_CHECK(offset + count <= 256);

    if ((offset + count - 1) >> 6 == offset >> 6) {
        return secp256k1_scalar_get_bits_limb32(a, offset, count);
    } else {
        VERIFY_CHECK((offset >> 6) + 1 < 4);
        return ((a->d[offset >> 6] >> (offset & 0x3F)) | (a->d[(offset >> 6) + 1] << (64 - (offset & 0x3F)))) & (0xFFFFFFFF >> (32 - count));
    }
}